

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void search(player *p)

{
  _Bool _Var1;
  int iVar2;
  object *obj;
  loc grid;
  wchar_t wVar3;
  wchar_t wVar4;
  
  if (p->timed[2] == 0) {
    _Var1 = no_light(p);
    if (((!_Var1) && (p->timed[4] == 0)) && (p->timed[6] == 0)) {
      iVar2 = (p->grid).y;
      for (wVar4 = iVar2 + L'\xffffffff'; wVar4 <= iVar2 + L'\x01'; wVar4 = wVar4 + L'\x01') {
        iVar2 = (p->grid).x;
        for (wVar3 = iVar2 + L'\xffffffff'; wVar3 <= iVar2 + L'\x01'; wVar3 = wVar3 + L'\x01') {
          grid.y = wVar4;
          grid.x = wVar3;
          _Var1 = square_issecretdoor(cave,grid);
          if (_Var1) {
            msg("You have found a secret door.");
            place_closed_door(cave,(loc_conflict)grid);
            disturb(p);
          }
          for (obj = square_object(cave,grid); obj != (object *)0x0; obj = obj->next) {
            if (obj->known != (object *)0x0) {
              _Var1 = ignore_item_ok(p,obj);
              if (!_Var1) {
                _Var1 = is_trapped_chest(obj);
                if ((_Var1) && (obj->known->pval != obj->pval)) {
                  msg("You have discovered a trap on the chest!");
                  obj->known->pval = obj->pval;
                  disturb(p);
                }
              }
            }
          }
          iVar2 = (p->grid).x;
        }
        iVar2 = (p->grid).y;
      }
    }
  }
  return;
}

Assistant:

void search(struct player *p)
{
	struct loc grid;

	/* Various conditions mean no searching */
	if (p->timed[TMD_BLIND] || no_light(p) ||
		p->timed[TMD_CONFUSED] || p->timed[TMD_IMAGE])
		return;

	/* Search the nearby grids, which are always in bounds */
	for (grid.y = (p->grid.y - 1); grid.y <= (p->grid.y + 1); grid.y++) {
		for (grid.x = (p->grid.x - 1); grid.x <= (p->grid.x + 1); grid.x++) {
			struct object *obj;

			/* Secret doors */
			if (square_issecretdoor(cave, grid)) {
				msg("You have found a secret door.");
				place_closed_door(cave, grid);
				disturb(p);
			}

			/* Traps on chests */
			for (obj = square_object(cave, grid); obj; obj = obj->next) {
				if (!obj->known || ignore_item_ok(p, obj)
						|| !is_trapped_chest(obj)) {
					continue;
				}

				if (obj->known->pval != obj->pval) {
					msg("You have discovered a trap on the chest!");
					obj->known->pval = obj->pval;
					disturb(p);
				}
			}
		}
	}
}